

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_op.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::CheckOpMessageBuilder::CheckOpMessageBuilder
          (CheckOpMessageBuilder *this,Nonnull<const_char_*> exprtext)

{
  size_t sVar1;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  if (exprtext == (Nonnull<const_char_*>)0x0) {
    std::ios::clear((int)this + (int)*(undefined8 *)(*(long *)this + -0x18));
  }
  else {
    sVar1 = strlen(exprtext);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,exprtext,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," (",2);
  return;
}

Assistant:

CheckOpMessageBuilder::CheckOpMessageBuilder(
    absl::Nonnull<const char*> exprtext) {
  stream_ << exprtext << " (";
}